

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O3

int envy_bios_parse_bit_d(envy_bios *bios,envy_bios_bit_entry *bit)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  envy_bios_d_dp_info_entry *peVar7;
  long lVar8;
  envy_bios_d_dp_info_before_link_speed *peVar9;
  ulong uVar10;
  envy_bios_d_dp_info_level_entry_table *peVar11;
  envy_bios_d_dp_info_level_entry *peVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  char *__format;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint local_48;
  uint local_44;
  uint local_40;
  
  (bios->d).bit = bit;
  uVar23 = 0;
  do {
    iVar3 = parse_at(bios,uVar23,(char **)0x0);
    uVar23 = uVar23 + 1;
  } while (iVar3 == 0);
  uVar13 = (bios->d).dp_info.offset;
  if (uVar13 != 0) {
    if ((uint)uVar13 < bios->length) {
      bVar2 = bios->data[(uint)uVar13];
      (bios->d).dp_info.version = bVar2;
    }
    else {
      (bios->d).dp_info.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      bVar2 = (bios->d).dp_info.version;
    }
    if (bVar2 - 0x40 < 2) {
      uVar21 = (ulong)(bios->d).dp_info.offset;
      uVar23 = bios->length;
      if ((uint)(uVar21 + 1) < uVar23) {
        (bios->d).dp_info.hlen = bios->data[uVar21 + 1];
        uVar19 = 0;
      }
      else {
        (bios->d).dp_info.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar19 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 2) < uVar23) {
        (bios->d).dp_info.rlen = bios->data[uVar21 + 2];
        uVar6 = 0;
      }
      else {
        (bios->d).dp_info.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar6 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 3) < uVar23) {
        (bios->d).dp_info.entriesnum = bios->data[uVar21 + 3];
        uVar22 = 0;
      }
      else {
        (bios->d).dp_info.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar22 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 4) < uVar23) {
        (bios->d).dp_info.target_size = bios->data[uVar21 + 4];
        uVar14 = 0;
      }
      else {
        (bios->d).dp_info.target_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar14 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 5) < uVar23) {
        (bios->d).dp_info.levelentrytables_count = bios->data[uVar21 + 5];
        uVar15 = 0;
      }
      else {
        (bios->d).dp_info.levelentrytables_count = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar15 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 6) < uVar23) {
        (bios->d).dp_info.levelentry_size = bios->data[uVar21 + 6];
        uVar16 = 0;
      }
      else {
        (bios->d).dp_info.levelentry_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar16 = 0xfffffff2;
      }
      uVar4 = (uint)uVar21;
      if ((uint)(uVar21 + 7) < uVar23) {
        (bios->d).dp_info.levelentry_count = bios->data[uVar21 + 7];
        uVar17 = 0;
      }
      else {
        (bios->d).dp_info.levelentry_count = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar4 = (uint)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar17 = 0xfffffff2;
      }
      if ((uint)((ulong)uVar4 + 8) < uVar23) {
        (bios->d).dp_info.flags = bios->data[(ulong)uVar4 + 8];
        uVar23 = 0;
      }
      else {
        (bios->d).dp_info.flags = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar23 = 0xfffffff2;
      }
      uVar23 = uVar6 | uVar19 | uVar22 | uVar14 | uVar15 | uVar16 | uVar17 | uVar23;
      (bios->d).dp_info.regular_vswing = 0;
      (bios->d).dp_info.low_vswing = 0;
    }
    else {
      if (bVar2 != 0x42) {
        __format = "Unknown d DP INFO table version 0x%x\n";
LAB_00269ad2:
        fprintf(_stderr,__format,(ulong)bVar2);
        return 0;
      }
      uVar21 = (ulong)(bios->d).dp_info.offset;
      uVar23 = bios->length;
      if ((uint)(uVar21 + 1) < uVar23) {
        (bios->d).dp_info.hlen = bios->data[uVar21 + 1];
        uVar19 = 0;
      }
      else {
        (bios->d).dp_info.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar19 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 2) < uVar23) {
        (bios->d).dp_info.rlen = bios->data[uVar21 + 2];
        uVar6 = 0;
      }
      else {
        (bios->d).dp_info.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar6 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 3) < uVar23) {
        (bios->d).dp_info.entriesnum = bios->data[uVar21 + 3];
        uVar22 = 0;
      }
      else {
        (bios->d).dp_info.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar22 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 4) < uVar23) {
        (bios->d).dp_info.target_size = bios->data[uVar21 + 4];
        uVar14 = 0;
      }
      else {
        (bios->d).dp_info.target_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar14 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 5) < uVar23) {
        (bios->d).dp_info.levelentrytables_count = bios->data[uVar21 + 5];
        uVar15 = 0;
      }
      else {
        (bios->d).dp_info.levelentrytables_count = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar15 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 6) < uVar23) {
        (bios->d).dp_info.levelentry_size = bios->data[uVar21 + 6];
        uVar16 = 0;
      }
      else {
        (bios->d).dp_info.levelentry_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar16 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 7) < uVar23) {
        (bios->d).dp_info.levelentry_count = bios->data[uVar21 + 7];
        uVar4 = 0;
      }
      else {
        (bios->d).dp_info.levelentry_count = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar4 = 0xfffffff2;
      }
      if ((uint)(uVar21 + 8) < uVar23) {
        (bios->d).dp_info.flags = bios->data[uVar21 + 8];
        uVar17 = 0;
      }
      else {
        (bios->d).dp_info.flags = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar21 = (ulong)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar17 = 0xfffffff2;
      }
      uVar5 = (uint)uVar21;
      if ((uint)(uVar21 + 10) < uVar23) {
        (bios->d).dp_info.regular_vswing = CONCAT11(bios->data[uVar21 + 10],bios->data[uVar21 + 9]);
        uVar18 = 0;
      }
      else {
        (bios->d).dp_info.regular_vswing = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar5 = (uint)(bios->d).dp_info.offset;
        uVar23 = bios->length;
        uVar18 = 0xfffffff2;
      }
      lVar8 = (ulong)uVar5 + 0xc;
      if ((uint)lVar8 < uVar23) {
        (bios->d).dp_info.low_vswing = CONCAT11(bios->data[lVar8],bios->data[(ulong)uVar5 + 0xb]);
        uVar23 = 0;
      }
      else {
        (bios->d).dp_info.low_vswing = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar23 = 0xfffffff2;
      }
      uVar23 = uVar6 | uVar19 | uVar22 | uVar14 | uVar15 | uVar16 | uVar4 | uVar17 | uVar18 | uVar23
      ;
    }
    (bios->d).dp_info.valid = uVar23 == 0;
    bVar2 = (bios->d).dp_info.entriesnum;
    peVar7 = (envy_bios_d_dp_info_entry *)malloc((ulong)((uint)bVar2 * 8) * 5);
    (bios->d).dp_info.entries = peVar7;
    if (bVar2 != 0) {
      uVar21 = 0;
      do {
        peVar7 = (bios->d).dp_info.entries + uVar21;
        uVar19 = (int)uVar21 * (uint)(bios->d).dp_info.rlen +
                 (uint)(bios->d).dp_info.hlen + *(int *)&(bios->d).dp_info & 0xffff;
        if (uVar19 + 1 < bios->length) {
          uVar13 = *(ushort *)(bios->data + uVar19);
          peVar7->offset = uVar13;
        }
        else {
          peVar7->offset = 0;
          fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
          uVar13 = peVar7->offset;
        }
        if (uVar13 != 0) {
          uVar24 = (ulong)uVar13;
          if ((uint)(uVar24 + 3) < bios->length) {
            puVar1 = bios->data;
            peVar7->key = CONCAT13(puVar1[uVar24 + 3],
                                   CONCAT12(puVar1[(ulong)uVar13 + 2],
                                            *(undefined2 *)(puVar1 + uVar13)));
            uVar19 = 0;
          }
          else {
            peVar7->key = 0;
            fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
            uVar24 = (ulong)peVar7->offset;
            uVar19 = 0xfffffff2;
          }
          lVar8 = uVar24 + 4;
          if ((uint)lVar8 < bios->length) {
            peVar7->flags = bios->data[lVar8];
            uVar6 = 0;
          }
          else {
            peVar7->flags = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar8);
            uVar24 = (ulong)peVar7->offset;
            uVar6 = 0xfffffff2;
          }
          uVar22 = bios->length;
          if ((uint)(uVar24 + 6) < uVar22) {
            peVar7->before_link_training = CONCAT11(bios->data[uVar24 + 6],bios->data[uVar24 + 5]);
            uVar14 = 0;
          }
          else {
            peVar7->before_link_training = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar24 + 5);
            uVar24 = (ulong)peVar7->offset;
            uVar22 = bios->length;
            uVar14 = 0xfffffff2;
          }
          if ((uint)(uVar24 + 8) < uVar22) {
            peVar7->after_link_training = CONCAT11(bios->data[uVar24 + 8],bios->data[uVar24 + 7]);
            local_40 = 0;
          }
          else {
            peVar7->after_link_training = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar24 + 7);
            uVar24 = (ulong)peVar7->offset;
            uVar22 = bios->length;
            local_40 = 0xfffffff2;
          }
          if ((uint)(uVar24 + 10) < uVar22) {
            peVar7->before_link_speed_0 = CONCAT11(bios->data[uVar24 + 10],bios->data[uVar24 + 9]);
            uVar15 = 0;
          }
          else {
            peVar7->before_link_speed_0 = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar24 + 9);
            uVar24 = (ulong)peVar7->offset;
            uVar22 = bios->length;
            uVar15 = 0xfffffff2;
          }
          if ((uint)(uVar24 + 0xc) < uVar22) {
            peVar7->enable_spread = CONCAT11(bios->data[uVar24 + 0xc],bios->data[uVar24 + 0xb]);
            local_44 = 0;
          }
          else {
            peVar7->enable_spread = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar24 + 0xb);
            uVar24 = (ulong)peVar7->offset;
            uVar22 = bios->length;
            local_44 = 0xfffffff2;
          }
          if ((uint)(uVar24 + 0xe) < uVar22) {
            peVar7->disable_spread = CONCAT11(bios->data[uVar24 + 0xe],bios->data[uVar24 + 0xd]);
            local_48 = 0;
          }
          else {
            peVar7->disable_spread = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar24 + 0xd);
            uVar24 = (ulong)peVar7->offset;
            uVar22 = bios->length;
            local_48 = 0xfffffff2;
          }
          if ((uint)(uVar24 + 0x10) < uVar22) {
            peVar7->disable_lt = CONCAT11(bios->data[uVar24 + 0x10],bios->data[uVar24 + 0xf]);
            uVar16 = 0;
          }
          else {
            peVar7->disable_lt = 0;
            fprintf(_stderr,"requested OOB u16 at 0x%04x\n",uVar24 + 0xf);
            uVar24 = (ulong)peVar7->offset;
            uVar22 = bios->length;
            uVar16 = 0xfffffff2;
          }
          uVar4 = (uint)uVar24;
          lVar8 = uVar24 + 0x11;
          if ((uint)lVar8 < uVar22) {
            peVar7->level_entry_table_index = bios->data[lVar8];
            uVar22 = 0;
          }
          else {
            peVar7->level_entry_table_index = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar8);
            uVar4 = (uint)peVar7->offset;
            uVar22 = 0xfffffff2;
          }
          if ((uint)((ulong)uVar4 + 0x12) < bios->length) {
            peVar7->hbr2_min_vdt_index = bios->data[(ulong)uVar4 + 0x12];
            uVar4 = 0;
          }
          else {
            peVar7->hbr2_min_vdt_index = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar4 = 0xfffffff2;
          }
          uVar23 = uVar23 | uVar16 | uVar22 | uVar4 |
                            uVar15 | local_44 | local_48 | uVar14 | local_40 | uVar19 | uVar6;
          peVar7->valid = uVar23 == 0;
          uVar19 = 4 - ((bios->d).dp_info.version < 0x42);
          uVar24 = (ulong)uVar19;
          peVar7->before_link_speed_nums = uVar19;
          peVar9 = (envy_bios_d_dp_info_before_link_speed *)malloc((ulong)(uVar19 * 6));
          peVar7->before_link_speed_entries = peVar9;
          lVar8 = 0;
          do {
            peVar9 = peVar7->before_link_speed_entries;
            uVar10 = (ulong)peVar7->before_link_speed_0 + lVar8;
            (&peVar9->offset)[lVar8] = (uint16_t)uVar10;
            uVar20 = uVar10 & 0xffff;
            if ((uint)uVar20 < bios->length) {
              (&peVar9->link_rate)[lVar8 * 2] = bios->data[uVar10 & 0xffff];
              uVar19 = 0;
            }
            else {
              (&peVar9->link_rate)[lVar8 * 2] = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              uVar20 = (ulong)(&peVar9->offset)[lVar8];
              uVar19 = 0xfffffff2;
            }
            if ((uint)(uVar20 + 2) < bios->length) {
              (&peVar9->link_rate_ptr)[lVar8] =
                   CONCAT11(bios->data[uVar20 + 2],bios->data[uVar20 + 1]);
              uVar6 = 0;
            }
            else {
              (&peVar9->link_rate_ptr)[lVar8] = 0;
              fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
              uVar6 = 0xfffffff2;
            }
            uVar23 = uVar23 | uVar19 | uVar6;
            (&peVar9->valid)[lVar8 * 2] = uVar23 == 0;
            lVar8 = lVar8 + 3;
            uVar24 = uVar24 - 1;
          } while (uVar24 != 0);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < (bios->d).dp_info.entriesnum);
    }
    bVar2 = (bios->d).dp_info.levelentrytables_count;
    uVar21 = (ulong)bVar2;
    peVar11 = (envy_bios_d_dp_info_level_entry_table *)malloc((ulong)bVar2 << 4);
    (bios->d).dp_info.level_entry_tables = peVar11;
    if (bVar2 != 0) {
      uVar24 = (ulong)(bios->d).dp_info.levelentry_count;
      uVar10 = 0;
      do {
        peVar11 = (bios->d).dp_info.level_entry_tables;
        peVar11[uVar10].offset =
             (ushort)(bios->d).dp_info.levelentry_size * (short)uVar10 * (short)uVar24 +
             (ushort)(bios->d).dp_info.rlen * (ushort)(bios->d).dp_info.entriesnum +
             (ushort)(bios->d).dp_info.hlen + (bios->d).dp_info.offset;
        peVar12 = (envy_bios_d_dp_info_level_entry *)malloc((ulong)(uint)((int)uVar24 * 8));
        peVar11[uVar10].level_entries = peVar12;
        if ((char)uVar24 == '\0') {
          uVar24 = 0;
        }
        else {
          uVar21 = 0;
          do {
            peVar12 = peVar11[uVar10].level_entries;
            uVar13 = (short)((int)uVar21 * (uint)(bios->d).dp_info.levelentry_size) +
                     peVar11[uVar10].offset;
            peVar12[uVar21].offset = uVar13;
            bVar2 = (bios->d).dp_info.version;
            if (bVar2 - 0x40 < 2) {
              if ((uint)uVar13 < bios->length) {
                peVar12[uVar21].post_cursor_2 = bios->data[uVar13];
                uVar19 = 0;
              }
              else {
                peVar12[uVar21].post_cursor_2 = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar13 = peVar12[uVar21].offset;
                uVar19 = 0xfffffff2;
              }
              uVar24 = (ulong)uVar13;
              lVar8 = uVar24 + 1;
              if ((uint)lVar8 < bios->length) {
                peVar12[uVar21].drive_current = bios->data[lVar8];
                uVar6 = 0;
              }
              else {
                peVar12[uVar21].drive_current = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar8);
                uVar24 = (ulong)peVar12[uVar21].offset;
                uVar6 = 0xfffffff2;
              }
              uVar22 = (uint)uVar24;
              lVar8 = uVar24 + 2;
              if ((uint)lVar8 < bios->length) {
                peVar12[uVar21].pre_emphasis = bios->data[lVar8];
                uVar14 = 0;
              }
              else {
                peVar12[uVar21].pre_emphasis = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar8);
                uVar22 = (uint)peVar12[uVar21].offset;
                uVar14 = 0xfffffff2;
              }
              if ((uint)((ulong)uVar22 + 3) < bios->length) {
                peVar12[uVar21].tx_pu = bios->data[(ulong)uVar22 + 3];
                uVar22 = 0;
              }
              else {
                peVar12[uVar21].tx_pu = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar22 = 0xfffffff2;
              }
              uVar22 = uVar6 | uVar19 | uVar14 | uVar22;
            }
            else {
              if (bVar2 != 0x42) {
                __format = "Unknown d DP INFO LEVEL ENTRY TABLE version 0x%x\n";
                goto LAB_00269ad2;
              }
              peVar12[uVar21].post_cursor_2 = '\0';
              if ((uint)uVar13 < bios->length) {
                peVar12[uVar21].drive_current = bios->data[uVar13];
                uVar19 = 0;
              }
              else {
                peVar12[uVar21].drive_current = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar13 = peVar12[uVar21].offset;
                uVar19 = 0xfffffff2;
              }
              lVar8 = (ulong)uVar13 + 1;
              if ((uint)lVar8 < bios->length) {
                peVar12[uVar21].pre_emphasis = bios->data[lVar8];
                uVar6 = 0;
              }
              else {
                peVar12[uVar21].pre_emphasis = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar8);
                uVar13 = peVar12[uVar21].offset;
                uVar6 = 0xfffffff2;
              }
              if ((uint)((ulong)uVar13 + 2) < bios->length) {
                peVar12[uVar21].tx_pu = bios->data[(ulong)uVar13 + 2];
                uVar22 = 0;
              }
              else {
                peVar12[uVar21].tx_pu = '\0';
                fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                uVar22 = 0xfffffff2;
              }
              uVar22 = uVar6 | uVar19 | uVar22;
            }
            uVar23 = uVar23 | uVar22;
            peVar12[uVar21].valid = uVar23 == 0;
            uVar21 = uVar21 + 1;
            uVar24 = (ulong)(bios->d).dp_info.levelentry_count;
          } while (uVar21 < uVar24);
          uVar21 = (ulong)(bios->d).dp_info.levelentrytables_count;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar21);
    }
  }
  return 0;
}

Assistant:

int
envy_bios_parse_bit_d(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_d *d = &bios->d;
	unsigned int idx = 0;

	d->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_d_dp_info(bios);

	return 0;
}